

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void highbd_resize_multistep
               (uint16_t *input,int length,uint16_t *output,int olength,uint16_t *otmp,int bd)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  uint in_ECX;
  uint16_t *in_RDX;
  uint in_ESI;
  uint16_t *in_RDI;
  uint16_t *in_R8;
  uint16_t *unaff_retaddr;
  uint16_t *in;
  int proj_filteredlength;
  int s;
  uint16_t *otmp2;
  int filteredlength;
  uint16_t *out;
  int steps;
  undefined8 in_stack_ffffffffffffff90;
  uint16_t *in_stack_ffffffffffffff98;
  uint16_t *in_stack_ffffffffffffffa0;
  uint16_t *output_00;
  uint16_t *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar4;
  uint local_3c;
  uint16_t *local_38;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar5;
  int length_00;
  
  if (in_ESI == in_ECX) {
    memcpy(in_RDX,in_RDI,(long)(int)in_ESI << 1);
  }
  else {
    local_3c = in_ESI;
    iVar1 = get_down2_steps((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                            (int)in_stack_ffffffffffffff90);
    if (iVar1 < 1) {
      highbd_interpolate((uint16_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),in_stack_ffffffffffffffa0,
                         (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (int)in_stack_ffffffffffffff98);
    }
    else {
      local_38 = (uint16_t *)0x0;
      output_00 = in_R8;
      uVar5 = local_3c;
      iVar2 = get_down2_length(local_3c,1);
      puVar3 = output_00 + iVar2;
      for (uVar4 = 0; (int)uVar4 < iVar1; uVar4 = uVar4 + 1) {
        in_stack_ffffffffffffffb0 = get_down2_length(local_3c,1);
        in_stack_ffffffffffffff98 = local_38;
        if (uVar4 == 0) {
          in_stack_ffffffffffffff98 = in_RDI;
        }
        if (((uVar4 != iVar1 - 1U) || (local_38 = in_RDX, in_stack_ffffffffffffffb0 != in_ECX)) &&
           (local_38 = in_R8, (uVar4 & 1) != 0)) {
          local_38 = puVar3;
        }
        iVar2 = (int)((ulong)in_RDX >> 0x20);
        length_00 = (int)((ulong)in_RDI >> 0x20);
        in_stack_ffffffffffffffa8 = in_stack_ffffffffffffff98;
        if ((local_3c & 1) == 0) {
          highbd_down2_symeven
                    (unaff_retaddr,length_00,(uint16_t *)CONCAT44(uVar5,in_stack_fffffffffffffff0),
                     iVar2);
        }
        else {
          highbd_down2_symodd(unaff_retaddr,length_00,
                              (uint16_t *)CONCAT44(uVar5,in_stack_fffffffffffffff0),iVar2);
        }
        local_3c = in_stack_ffffffffffffffb0;
      }
      if (local_3c != in_ECX) {
        highbd_interpolate((uint16_t *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),
                           (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),output_00,
                           (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                           (int)in_stack_ffffffffffffff98);
      }
    }
  }
  return;
}

Assistant:

static void highbd_resize_multistep(const uint16_t *const input, int length,
                                    uint16_t *output, int olength,
                                    uint16_t *otmp, int bd) {
  if (length == olength) {
    memcpy(output, input, sizeof(output[0]) * length);
    return;
  }
  const int steps = get_down2_steps(length, olength);

  if (steps > 0) {
    uint16_t *out = NULL;
    int filteredlength = length;

    assert(otmp != NULL);
    uint16_t *otmp2 = otmp + get_down2_length(length, 1);
    for (int s = 0; s < steps; ++s) {
      const int proj_filteredlength = get_down2_length(filteredlength, 1);
      const uint16_t *const in = (s == 0 ? input : out);
      if (s == steps - 1 && proj_filteredlength == olength)
        out = output;
      else
        out = (s & 1 ? otmp2 : otmp);
      if (filteredlength & 1)
        highbd_down2_symodd(in, filteredlength, out, bd);
      else
        highbd_down2_symeven(in, filteredlength, out, bd);
      filteredlength = proj_filteredlength;
    }
    if (filteredlength != olength) {
      highbd_interpolate(out, filteredlength, output, olength, bd);
    }
  } else {
    highbd_interpolate(input, length, output, olength, bd);
  }
}